

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O2

TxSize wallet::CalculateMaximumSignedTxSize
                 (CTransaction *tx,CWallet *wallet,vector<CTxOut,_std::allocator<CTxOut>_> *txouts,
                 CCoinControl *coin_control)

{
  CTxOut *pCVar1;
  CTxOut *pCVar2;
  pointer pCVar3;
  CCoinControl *this;
  CWallet *wallet_00;
  Descriptor *desc;
  bool bVar4;
  ulong uVar5;
  size_t sVar6;
  _Storage<long,_true> _Var7;
  int iVar8;
  int iVar9;
  CTxOut *txo;
  CTxOut *t;
  long lVar10;
  __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_> __it;
  pointer outpoint;
  ulong nWeight;
  long lVar11;
  uint uVar12;
  __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_> _Var13;
  long in_FS_OFFSET;
  optional<long> oVar14;
  TxSize TVar15;
  int64_t local_100;
  CCoinControl *coin_control_local;
  CWallet *wallet_local;
  Descriptor *local_d0;
  _Storage<CTxIn,_false> local_c8;
  prevector<28U,_unsigned_char,_unsigned_int,_int> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x68;
  if (uVar5 < 0xfd) {
    iVar8 = 9;
  }
  else if (uVar5 < 0x10000) {
    iVar8 = 0xb;
  }
  else {
    iVar8 = (uint)(uVar5 >> 0x20 != 0) * 4 + 0xd;
  }
  uVar5 = ((long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_start) / 0x28;
  if (uVar5 < 0xfd) {
    iVar9 = 1;
  }
  else if (uVar5 < 0x10000) {
    iVar9 = 3;
  }
  else {
    iVar9 = (uint)(uVar5 >> 0x20 != 0) * 4 + 5;
  }
  uVar5 = (ulong)(uint)((iVar9 + iVar8) * 4);
  __it._M_current =
       (txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.super__Vector_impl_data
       ._M_start;
  pCVar1 = (txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_c8._0_8_ = &wallet_local;
  local_c8._8_8_ = &coin_control_local;
  lVar10 = (long)pCVar1 - (long)__it._M_current;
  coin_control_local = coin_control;
  wallet_local = wallet;
  for (lVar11 = lVar10 / 0x28 >> 2; 0 < lVar11; lVar11 = lVar11 + -1) {
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
            ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                          *)&local_c8._M_value,__it);
    _Var13._M_current = __it._M_current;
    if (bVar4) goto LAB_0020ef25;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
            ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                          *)&local_c8._M_value,__it._M_current + 1);
    _Var13._M_current = __it._M_current + 1;
    if (bVar4) goto LAB_0020ef25;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
            ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                          *)&local_c8._M_value,__it._M_current + 2);
    _Var13._M_current = __it._M_current + 2;
    if (bVar4) goto LAB_0020ef25;
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
            ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                          *)&local_c8._M_value,__it._M_current + 3);
    _Var13._M_current = __it._M_current + 3;
    if (bVar4) goto LAB_0020ef25;
    __it._M_current = __it._M_current + 4;
    lVar10 = lVar10 + -0xa0;
  }
  lVar10 = lVar10 / 0x28;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      _Var13._M_current = pCVar1;
      if ((lVar10 != 3) ||
         (bVar4 = __gnu_cxx::__ops::
                  _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
                  ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                                *)&local_c8._M_value,__it), _Var13._M_current = __it._M_current,
         bVar4)) goto LAB_0020ef25;
      __it._M_current = __it._M_current + 1;
    }
    bVar4 = __gnu_cxx::__ops::
            _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
            ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                          *)&local_c8._M_value,__it);
    _Var13._M_current = __it._M_current;
    if (bVar4) goto LAB_0020ef25;
    __it._M_current = __it._M_current + 1;
  }
  bVar4 = __gnu_cxx::__ops::
          _Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::$_0>
          ::operator()((_Iter_pred<wallet::CalculateMaximumSignedTxSize(CTransaction_const&,wallet::CWallet_const*,std::vector<CTxOut,std::allocator<CTxOut>>const&,wallet::CCoinControl_const*)::__0>
                        *)&local_c8._M_value,__it);
  _Var13._M_current = __it._M_current;
  if (!bVar4) {
    _Var13._M_current = pCVar1;
  }
LAB_0020ef25:
  nWeight = uVar5 | 2;
  if (_Var13._M_current == pCVar1) {
    nWeight = uVar5;
  }
  pCVar2 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (t = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_start; t != pCVar2; t = t + 1) {
    sVar6 = GetSerializeSize<CTxOut>(t);
    nWeight = nWeight + sVar6 * 4;
  }
  uVar12 = 0;
  local_100 = -1;
  do {
    wallet_00 = wallet_local;
    this = coin_control_local;
    uVar5 = (ulong)uVar12;
    pCVar3 = (txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(((long)(txouts->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                       super__Vector_impl_data._M_finish - (long)pCVar3) / 0x28) <= uVar5) {
      local_100 = GetVirtualTransactionSize(nWeight,0,0);
LAB_0020f093:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      TVar15.weight = nWeight;
      TVar15.vsize = local_100;
      return TVar15;
    }
    outpoint = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start + uVar5;
    bVar4 = CWallet::CanGrindR(wallet_local);
    if (this == (CCoinControl *)0x0) {
LAB_0020efd1:
      prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
                (&local_58,&pCVar3[uVar5].scriptPubKey.super_CScriptBase);
      GetDescriptor((wallet *)&local_d0,wallet_00,this,(CScript *)&local_58);
      prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector(&local_58);
      desc = local_d0;
      if (local_d0 != (Descriptor *)0x0) {
        std::_Optional_payload_base<CTxIn>::_Optional_payload_base<CTxIn_const&>
                  ((_Optional_payload_base<CTxIn> *)&local_c8,outpoint);
        oVar14 = MaxInputWeight(desc,(optional<CTxIn> *)&local_c8._M_value,this,
                                _Var13._M_current != pCVar1,bVar4);
        _Var7._M_value =
             oVar14.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_payload;
        std::_Optional_payload_base<CTxIn>::_M_reset
                  ((_Optional_payload_base<CTxIn> *)&local_c8._M_value);
        if (local_d0 != (Descriptor *)0x0) {
          (*local_d0->_vptr_Descriptor[1])();
        }
        if (((undefined1  [16])
             oVar14.super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_0020f067;
      }
      nWeight = 0xffffffffffffffff;
      goto LAB_0020f093;
    }
    oVar14 = CCoinControl::GetInputWeight(this,&outpoint->prevout);
    _Var7._M_value =
         oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
         ._M_payload;
    if (((undefined1  [16])
         oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) == (undefined1  [16])0x0) goto LAB_0020efd1;
LAB_0020f067:
    if (_Var7._M_value < 0) {
      __assert_fail("*txin_weight > -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/spend.cpp"
                    ,0x9e,
                    "TxSize wallet::CalculateMaximumSignedTxSize(const CTransaction &, const CWallet *, const std::vector<CTxOut> &, const CCoinControl *)"
                   );
    }
    nWeight = nWeight + _Var7._M_value;
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

TxSize CalculateMaximumSignedTxSize(const CTransaction &tx, const CWallet *wallet, const std::vector<CTxOut>& txouts, const CCoinControl* coin_control)
{
    // version + nLockTime + input count + output count
    int64_t weight = (4 + 4 + GetSizeOfCompactSize(tx.vin.size()) + GetSizeOfCompactSize(tx.vout.size())) * WITNESS_SCALE_FACTOR;
    // Whether any input spends a witness program. Necessary to run before the next loop over the
    // inputs in order to accurately compute the compactSize length for the witness data per input.
    bool is_segwit = std::any_of(txouts.begin(), txouts.end(), [&](const CTxOut& txo) {
        std::unique_ptr<Descriptor> desc{GetDescriptor(wallet, coin_control, txo.scriptPubKey)};
        if (desc) return IsSegwit(*desc);
        return false;
    });
    // Segwit marker and flag
    if (is_segwit) weight += 2;

    // Add the size of the transaction outputs.
    for (const auto& txo : tx.vout) weight += GetSerializeSize(txo) * WITNESS_SCALE_FACTOR;

    // Add the size of the transaction inputs as if they were signed.
    for (uint32_t i = 0; i < txouts.size(); i++) {
        const auto txin_weight = GetSignedTxinWeight(wallet, coin_control, tx.vin[i], txouts[i], is_segwit, wallet->CanGrindR());
        if (!txin_weight) return TxSize{-1, -1};
        assert(*txin_weight > -1);
        weight += *txin_weight;
    }

    // It's ok to use 0 as the number of sigops since we never create any pathological transaction.
    return TxSize{GetVirtualTransactionSize(weight, 0, 0), weight};
}